

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O0

int32_t T_CString_integerToString_63(char *buffer,int32_t v,int32_t radix)

{
  byte bVar1;
  char local_4c;
  uint local_48;
  int local_44;
  uint32_t uval;
  int32_t length;
  char local_38 [3];
  uint8_t digit;
  int32_t tbx;
  char tbuf [30];
  int32_t radix_local;
  int32_t v_local;
  char *buffer_local;
  
  local_44 = 0;
  local_48 = v;
  if ((v < 0) && (radix == 10)) {
    local_48 = -v;
    local_44 = 1;
    *buffer = '-';
  }
  length = 0x1d;
  tbuf[0x15] = '\0';
  do {
    bVar1 = (byte)(local_48 % (uint)radix);
    if (bVar1 < 10) {
      local_4c = bVar1 + 0x30;
    }
    else {
      local_4c = bVar1 + 0x37;
    }
    length = length + -1;
    local_38[length] = local_4c;
    local_48 = local_48 / (uint)radix;
  } while (local_48 != 0);
  tbuf._24_4_ = radix;
  unique0x100000dd = v;
  strcpy(buffer + local_44,local_38 + length);
  return local_44 + (0x1d - length);
}

Assistant:

U_CAPI int32_t U_EXPORT2
T_CString_integerToString(char* buffer, int32_t v, int32_t radix)
{
    char      tbuf[30];
    int32_t   tbx    = sizeof(tbuf);
    uint8_t   digit;
    int32_t   length = 0;
    uint32_t  uval;
    
    U_ASSERT(radix>=2 && radix<=16);
    uval = (uint32_t) v;
    if(v<0 && radix == 10) {
        /* Only in base 10 do we conside numbers to be signed. */
        uval = (uint32_t)(-v); 
        buffer[length++] = '-';
    }
    
    tbx = sizeof(tbuf)-1;
    tbuf[tbx] = 0;   /* We are generating the digits backwards.  Null term the end. */
    do {
        digit = (uint8_t)(uval % radix);
        tbuf[--tbx] = (char)(T_CString_itosOffset(digit));
        uval  = uval / radix;
    } while (uval != 0);
    
    /* copy converted number into user buffer  */
    uprv_strcpy(buffer+length, tbuf+tbx);
    length += sizeof(tbuf) - tbx -1;
    return length;
}